

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

void __thiscall
Clasp::MinimizeBuilder::prepareLevels
          (MinimizeBuilder *this,Solver *s,SumVec *adjust,WeightVec *prios)

{
  Literal p;
  ValueRep VVar1;
  bool bVar2;
  Var VVar3;
  iterator first;
  iterator pMVar4;
  long lVar5;
  pod_vector<int,_std::allocator<int>_> *in_RCX;
  pod_vector<long,_std::allocator<long>_> *in_RDX;
  Solver *in_RSI;
  pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_> *in_RDI;
  wsum_t w;
  Literal x;
  const_iterator k;
  wsum_t R;
  weight_t L;
  weight_t P;
  const_iterator end;
  const_iterator it;
  iterator j;
  undefined4 in_stack_ffffffffffffff48;
  Var in_stack_ffffffffffffff4c;
  Solver *in_stack_ffffffffffffff50;
  Solver *in_stack_ffffffffffffff58;
  Var in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  int local_84;
  pair<Clasp::Literal,_int> local_80;
  MLit local_78;
  uint32 local_6c;
  long local_68;
  Literal local_5c;
  iterator local_58;
  long local_50;
  size_type local_48;
  weight_t local_44;
  iterator local_40;
  iterator local_38;
  iterator local_30;
  pod_vector<int,_std::allocator<int>_> *local_20;
  pod_vector<long,_std::allocator<long>_> *local_18;
  Solver *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  first = bk_lib::
          pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::
          begin(in_RDI);
  pMVar4 = bk_lib::
           pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::
           end(in_RDI);
  std::stable_sort<Clasp::MinimizeBuilder::MLit*,Clasp::MinimizeBuilder::CmpPrio>(first,pMVar4);
  bk_lib::pod_vector<int,_std::allocator<int>_>::clear(local_20);
  bk_lib::pod_vector<long,_std::allocator<long>_>::clear(local_18);
  local_30 = bk_lib::
             pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>
             ::begin(in_RDI);
  local_38 = bk_lib::
             pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>
             ::begin(in_RDI);
  local_40 = bk_lib::
             pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>
             ::end(in_RDI);
  do {
    if (local_38 == local_40) {
      bk_lib::
      pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::end
                (in_RDI);
      bk_lib::
      pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::erase
                (in_RDI,first,
                 (iterator)
                 CONCAT17(in_stack_ffffffffffffff67,
                          CONCAT16(in_stack_ffffffffffffff66,
                                   CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))));
      return;
    }
    local_44 = local_38->prio;
    local_48 = bk_lib::pod_vector<int,_std::allocator<int>_>::size(local_20);
    local_50 = 0;
    while( true ) {
      in_stack_ffffffffffffff67 = false;
      if (local_38 != local_40) {
        in_stack_ffffffffffffff67 = local_38->prio == local_44;
      }
      if ((bool)in_stack_ffffffffffffff67 == false) break;
      local_5c.rep_ = (local_38->lit).rep_;
      local_68 = (long)local_38->weight;
      local_58 = local_38;
      while( true ) {
        local_58 = local_58 + 1;
        in_stack_ffffffffffffff66 = false;
        if (local_58 != local_40) {
          in_stack_ffffffffffffff60 = Literal::var(&local_58->lit);
          VVar3 = Literal::var(&local_5c);
          in_stack_ffffffffffffff66 = false;
          if (in_stack_ffffffffffffff60 == VVar3) {
            in_stack_ffffffffffffff66 = local_58->prio == local_44;
          }
        }
        if ((bool)in_stack_ffffffffffffff66 == false) break;
        bVar2 = Clasp::operator==((Literal *)in_stack_ffffffffffffff50,
                                  (Literal *)
                                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        if (bVar2) {
          lVar5 = (long)local_58->weight;
        }
        else {
          lVar5 = -(long)local_58->weight;
          local_50 = local_58->weight + local_50;
        }
        local_68 = local_68 + lVar5;
      }
      if (local_68 < 0) {
        local_50 = local_68 + local_50;
        local_6c = (uint32)Literal::operator~((Literal *)
                                              CONCAT44(in_stack_ffffffffffffff4c,
                                                       in_stack_ffffffffffffff48));
        local_68 = -local_68;
        local_5c = (Literal)local_6c;
      }
      if (local_68 == 0) {
LAB_001b08f8:
        p.rep_._2_1_ = in_stack_ffffffffffffff66;
        p.rep_._0_2_ = in_stack_ffffffffffffff64;
        p.rep_._3_1_ = in_stack_ffffffffffffff67;
        bVar2 = Solver::isTrue(in_stack_ffffffffffffff58,p);
        if (bVar2) {
          local_50 = local_68 + local_50;
        }
      }
      else {
        in_stack_ffffffffffffff58 = local_10;
        Literal::var(&local_5c);
        VVar1 = Solver::value(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        if (VVar1 != '\0') goto LAB_001b08f8;
        if ((int)local_68 != local_68) {
          Potassco::fail(0x4b,
                         "void Clasp::MinimizeBuilder::prepareLevels(const Solver &, SumVec &, WeightVec &)"
                         ,0x290,"static_cast<weight_t>(w) == w","MinimizeBuilder: weight too large",
                         0);
        }
        local_84 = (int)local_68;
        std::pair<Clasp::Literal,_int>::pair<Clasp::Literal_&,_int,_true>
                  (&local_80,&local_5c,&local_84);
        MLit::MLit(&local_78,&local_80,local_48);
        local_30->lit = (Literal)local_78.lit.rep_;
        local_30->prio = local_78.prio;
        local_30->weight = local_78.weight;
        local_30 = local_30 + 1;
      }
      local_38 = local_58;
    }
    bk_lib::pod_vector<int,_std::allocator<int>_>::push_back
              ((pod_vector<int,_std::allocator<int>_> *)
               (ulong)CONCAT16(in_stack_ffffffffffffff66,
                               CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
               (int *)in_stack_ffffffffffffff58);
    bk_lib::pod_vector<long,_std::allocator<long>_>::push_back
              ((pod_vector<long,_std::allocator<long>_> *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,
                                 CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))),
               (long *)in_stack_ffffffffffffff58);
  } while( true );
}

Assistant:

void MinimizeBuilder::prepareLevels(const Solver& s, SumVec& adjust, WeightVec& prios) {
	// group first by decreasing priorities and then by variables
	std::stable_sort(lits_.begin(), lits_.end(), CmpPrio());
	prios.clear(); adjust.clear();
	// assign levels and simplify lits
	LitVec::iterator j = lits_.begin();
	for (LitVec::const_iterator it = lits_.begin(), end = lits_.end(); it != end;) {
		const weight_t P = it->prio, L = static_cast<weight_t>(prios.size());
		wsum_t R = 0;
		for (LitVec::const_iterator k; it != end && it->prio == P; it = k) {
			Literal x(it->lit); // make literal unique wrt this level
			wsum_t  w = it->weight;
			for (k = it + 1; k != end && k->lit.var() == x.var() && k->prio == P; ++k) {
				if (k->lit == x){ w += k->weight; }
				else            { w -= k->weight; R += k->weight; }
			}
			if (w < 0){
				R += w;
				x  = ~x;
				w  = -w;
			}
			if (w && s.value(x.var()) == value_free) {
				POTASSCO_CHECK(static_cast<weight_t>(w) == w, EOVERFLOW, "MinimizeBuilder: weight too large");
				*j++ = MLit(WeightLiteral(x, static_cast<weight_t>(w)), L);
			}
			else if (s.isTrue(x)) { R += w; }
		}
		prios.push_back(P);
		adjust.push_back(R);
	}
	lits_.erase(j, lits_.end());
}